

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

shared_ptr<peg::Ope> __thiscall peg::cap(peg *this,shared_ptr<peg::Ope> *ope,MatchAction *ma)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<peg::Ope> sVar1;
  shared_ptr<peg::Capture> local_30;
  MatchAction *local_20;
  MatchAction *ma_local;
  shared_ptr<peg::Ope> *ope_local;
  
  local_20 = ma;
  ma_local = (MatchAction *)ope;
  ope_local = (shared_ptr<peg::Ope> *)this;
  std::
  make_shared<peg::Capture,std::shared_ptr<peg::Ope>const&,std::function<void(char_const*,unsigned_long,peg::Context&)>&>
            ((shared_ptr<peg::Ope> *)&local_30,
             (function<void_(const_char_*,_unsigned_long,_peg::Context_&)> *)ope);
  std::shared_ptr<peg::Ope>::shared_ptr<peg::Capture,void>((shared_ptr<peg::Ope> *)this,&local_30);
  std::shared_ptr<peg::Capture>::~shared_ptr(&local_30);
  sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<peg::Ope>)sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Ope> cap(const std::shared_ptr<Ope>& ope, Capture::MatchAction ma) {
    return std::make_shared<Capture>(ope, ma);
}